

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForbiddenPointFinder.cpp
# Opt level: O2

bool __thiscall
ForbiddenPointFinder::isFour(ForbiddenPointFinder *this,int x,int y,int nColor,int nDir)

{
  Stone *pSVar1;
  Stone SVar2;
  Stone SVar3;
  bool bVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  Stone (*paSVar9) [17];
  Stone *pSVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  
  iVar7 = x + 1;
  if ((this->cBoard[iVar7][(long)y + 1] != Empty) || (bVar4 = isFive(this,x,y,nColor), bVar4)) {
LAB_00102da1:
    bVar4 = false;
  }
  else {
    if (nColor == 1) {
      SVar3 = White;
    }
    else {
      if ((nColor != 0) || (bVar4 = isOverline(this,x,y), bVar4)) goto LAB_00102da1;
      SVar3 = Black;
    }
    pSVar1 = this->cBoard[iVar7] + (long)y + 1;
    *pSVar1 = SVar3;
    if (nDir - 1U < 4) {
      iVar14 = y + 1;
      switch(nDir) {
      case 1:
        uVar13 = (ulong)(uint)x;
        while (iVar7 = (int)uVar13, 0 < iVar7) {
          SVar2 = this->cBoard[uVar13][(long)y + 1];
          if (SVar2 != SVar3) {
            if (SVar2 == Empty) {
              bVar5 = isFive(this,iVar7 + -1,y,0,1);
              bVar4 = true;
              if (bVar5) goto LAB_001030c5;
            }
            break;
          }
          uVar13 = (ulong)(iVar7 - 1);
        }
        lVar6 = (long)(x + 2);
        pSVar10 = this->cBoard[lVar6] + (long)y + 1;
        iVar7 = x;
LAB_00103004:
        iVar7 = iVar7 + 1;
        if (lVar6 < 0x10) {
          if (*pSVar10 == SVar3) goto code_r0x00103015;
          if (*pSVar10 == Empty) {
            iVar14 = 1;
LAB_001030b4:
            bVar5 = isFive(this,iVar7,y,0,iVar14);
            bVar4 = true;
            if (!bVar5) break;
            goto LAB_001030c5;
          }
        }
        break;
      case 2:
        for (uVar11 = y; 0 < (int)uVar11; uVar11 = uVar11 - 1) {
          SVar2 = this->cBoard[iVar7][uVar11];
          if (SVar2 != SVar3) {
            if (SVar2 == Empty) {
              bVar5 = isFive(this,x,uVar11 - 1,0,2);
              bVar4 = true;
              if (bVar5) goto LAB_001030c5;
            }
            break;
          }
        }
        lVar6 = (long)(y + 2);
        y = iVar14;
        for (; lVar6 < 0x10; lVar6 = lVar6 + 1) {
          SVar2 = this->cBoard[iVar7][lVar6];
          if (SVar2 != SVar3) {
            if (SVar2 == Empty) {
              iVar14 = 2;
              iVar7 = x;
              goto LAB_001030b4;
            }
            break;
          }
          y = y + 1;
        }
        break;
      case 3:
        uVar13 = (ulong)(uint)x;
        uVar11 = y;
        while( true ) {
          iVar12 = (int)uVar13;
          if ((iVar12 < 1) || ((int)uVar11 < 1)) goto LAB_00102eec;
          SVar2 = this->cBoard[uVar13][uVar11];
          if (SVar2 != SVar3) break;
          uVar13 = (ulong)(iVar12 - 1);
          uVar11 = uVar11 - 1;
        }
        if (SVar2 == Empty) {
          bVar5 = isFive(this,iVar12 + -1,uVar11 - 1,0,3);
          bVar4 = true;
          if (bVar5) goto LAB_001030c5;
        }
LAB_00102eec:
        lVar6 = (long)(x + 2);
        lVar8 = (long)(y + 2);
        pSVar10 = this->cBoard[lVar6] + lVar8;
        y = iVar14;
        while( true ) {
          if ((0xf < lVar6) || (0xf < lVar8)) goto LAB_001030c3;
          if (*pSVar10 != SVar3) break;
          lVar6 = lVar6 + 1;
          lVar8 = lVar8 + 1;
          y = y + 1;
          pSVar10 = pSVar10 + 0x12;
          iVar7 = iVar7 + 1;
        }
        if (*pSVar10 == Empty) {
          iVar14 = 3;
          goto LAB_001030b4;
        }
        break;
      case 4:
        lVar6 = (long)(y + 2);
        pSVar10 = this->cBoard[0] + lVar6;
        uVar13 = (ulong)(uint)x;
        while( true ) {
          iVar12 = (int)uVar13;
          if ((iVar12 < 1) || (0xf < lVar6)) goto LAB_00102f72;
          if (pSVar10[uVar13 * 0x11] != SVar3) break;
          uVar13 = (ulong)(iVar12 - 1);
          lVar6 = lVar6 + 1;
          iVar14 = iVar14 + 1;
          pSVar10 = pSVar10 + 1;
        }
        if (pSVar10[uVar13 * 0x11] == Empty) {
          bVar5 = isFive(this,iVar12 + -1,iVar14,0,4);
          bVar4 = true;
          if (bVar5) goto LAB_001030c5;
        }
LAB_00102f72:
        lVar6 = (long)(x + 2);
        paSVar9 = this->cBoard + lVar6;
        while( true ) {
          if ((0xf < lVar6) || (y < 1)) goto LAB_001030c3;
          if ((*paSVar9)[(uint)y] != SVar3) break;
          lVar6 = lVar6 + 1;
          y = y - 1;
          iVar7 = iVar7 + 1;
          paSVar9 = paSVar9 + 1;
        }
        if ((*paSVar9)[(uint)y] == Empty) {
          y = y - 1;
          iVar14 = 4;
          goto LAB_001030b4;
        }
      }
    }
LAB_001030c3:
    bVar4 = false;
LAB_001030c5:
    *pSVar1 = Empty;
  }
  return bVar4;
code_r0x00103015:
  lVar6 = lVar6 + 1;
  pSVar10 = pSVar10 + 0x11;
  goto LAB_00103004;
}

Assistant:

bool ForbiddenPointFinder::isFour(int x, int y, int nColor, int nDir) {
    if (cBoard[x + 1][y + 1] != Stone::Empty)
        return false;

    if (isFive(x, y, nColor))    // five?
        return false;
    else if ((nColor == 0) && (isOverline(x, y)))    // black overline?
        return false;
    else {
        Stone c;
        if (nColor == 0)    // black
            c = Stone::Black;
        else if (nColor == 1)    // white
            c = Stone::White;
        else
            return false;

        setStone(x, y, c);

        int i, j;

        switch (nDir) {
            case 1:        // horizontal direction
                i = x;
                while (i > 0) {
                    if (cBoard[i][y + 1] == c) {
                        i--;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[i][y + 1] == c) {
                        i++;
                        continue;
                    } else if (cBoard[i][y + 1] == Stone::Empty) {
                        if (isFive(i - 1, y, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 2:        // vertial direction
                i = y;
                while (i > 0) {
                    if (cBoard[x + 1][i] == c) {
                        i--;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = y + 2;
                while (i < (BoardSize + 1)) {
                    if (cBoard[x + 1][i] == c) {
                        i++;
                        continue;
                    } else if (cBoard[x + 1][i] == Stone::Empty) {
                        if (isFive(x, i - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 3:        // diagonal direction - '/'
                i = x;
                j = y;
                while ((i > 0) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y + 2;
                while ((i < (BoardSize + 1)) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            case 4:        // diagonal direction - '\'
                i = x;
                j = y + 2;
                while ((i > 0) && (j < (BoardSize + 1))) {
                    if (cBoard[i][j] == c) {
                        i--;
                        j++;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                i = x + 2;
                j = y;
                while ((i < (BoardSize + 1)) && (j > 0)) {
                    if (cBoard[i][j] == c) {
                        i++;
                        j--;
                        continue;
                    } else if (cBoard[i][j] == Stone::Empty) {
                        if (isFive(i - 1, j - 1, 0, nDir)) {
                            setStone(x, y, Stone::Empty);
                            return true;
                        } else
                            break;
                    } else
                        break;
                }
                setStone(x, y, Stone::Empty);
                return false;
                break;
            default:
                setStone(x, y, Stone::Empty);
                return false;
                break;
        }
    }
}